

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O3

int dleq_generate(PMBTOKEN_METHOD *method,CBB *cbb,TRUST_TOKEN_ISSUER_KEY *priv,EC_JACOBIAN *T,
                 EC_JACOBIAN *S,EC_JACOBIAN *W,EC_JACOBIAN *Ws,uint8_t private_metadata)

{
  EC_PRECOMP *p0;
  EC_PRECOMP *p1;
  EC_GROUP *group;
  int iVar1;
  int iVar2;
  int iVar3;
  BN_ULONG mask;
  EC_SCALAR uo;
  EC_SCALAR vo;
  EC_SCALAR minus_co;
  EC_SCALAR k1;
  EC_SCALAR k0;
  EC_SCALAR ks1;
  EC_SCALAR ks0;
  EC_SCALAR cb;
  EC_SCALAR v1;
  EC_SCALAR v0;
  EC_SCALAR u1;
  EC_SCALAR u0;
  EC_SCALAR c1;
  EC_SCALAR c0;
  EC_SCALAR vs;
  EC_SCALAR us;
  EC_SCALAR c;
  EC_SCALAR cs;
  EC_SCALAR yb;
  EC_SCALAR xb;
  EC_SCALAR co;
  EC_SCALAR cb_mont;
  EC_SCALAR vb;
  EC_SCALAR ub;
  EC_SCALAR cs_mont;
  EC_AFFINE K11;
  EC_AFFINE K10;
  EC_AFFINE K01;
  EC_AFFINE K00;
  EC_AFFINE affines [10];
  EC_JACOBIAN jacobians [10];
  EC_PRECOMP pubo_precomp;
  EC_SCALAR local_2900;
  EC_SCALAR local_28b8;
  EC_SCALAR local_2870;
  EC_SCALAR local_2828;
  EC_SCALAR local_27e0;
  EC_SCALAR local_2798;
  EC_SCALAR local_2750;
  EC_SCALAR local_2708;
  EC_SCALAR local_26c0;
  EC_SCALAR local_2678;
  EC_SCALAR local_2630;
  EC_SCALAR local_25e8;
  EC_SCALAR local_25a0;
  EC_SCALAR local_2558;
  EC_SCALAR local_2510;
  EC_SCALAR local_24c8;
  EC_SCALAR local_2480;
  EC_SCALAR local_2438;
  EC_SCALAR local_23f0;
  EC_SCALAR local_23a8;
  EC_SCALAR local_2360;
  EC_SCALAR local_2318;
  EC_SCALAR local_22d0;
  EC_SCALAR local_2288;
  EC_SCALAR local_2240;
  EC_AFFINE local_21f8;
  EC_AFFINE local_2168;
  EC_AFFINE local_20d8;
  EC_AFFINE local_2048;
  EC_AFFINE local_1fb8;
  EC_AFFINE local_1f28;
  EC_AFFINE local_1e98;
  EC_AFFINE local_1e08;
  EC_AFFINE local_1d78;
  EC_AFFINE local_1ce8;
  EC_AFFINE local_1c58;
  EC_AFFINE local_1bc8;
  EC_AFFINE local_1b38;
  EC_AFFINE local_1aa8;
  EC_JACOBIAN local_1a18;
  undefined1 local_1940 [216];
  undefined1 local_1868 [216];
  undefined1 local_1790 [216];
  EC_JACOBIAN local_16b8;
  EC_JACOBIAN local_15e0;
  EC_JACOBIAN local_1508;
  EC_JACOBIAN local_1430;
  EC_JACOBIAN local_1358;
  EC_JACOBIAN local_1280;
  EC_PRECOMP local_11a0;
  
  group = method->group;
  iVar1 = ec_random_nonzero_scalar(group,&local_2750,"");
  iVar3 = 0;
  iVar2 = 0;
  if (iVar1 != 0) {
    iVar1 = ec_random_nonzero_scalar(group,&local_2798,"");
    iVar2 = iVar3;
    if (iVar1 != 0) {
      p0 = &method->g_precomp;
      p1 = &method->h_precomp;
      iVar1 = ec_point_mul_scalar_precomp
                        (group,&local_16b8,p0,&local_2750,p1,&local_2798,(EC_PRECOMP *)0x0,
                         (EC_SCALAR *)0x0);
      if (iVar1 != 0) {
        iVar1 = ec_point_mul_scalar_batch
                          (group,&local_15e0,T,&local_2750,S,&local_2798,(EC_JACOBIAN *)0x0,
                           (EC_SCALAR *)0x0);
        if (iVar1 != 0) {
          mask = -(ulong)(private_metadata & 1);
          ec_scalar_select(group,&local_23a8,mask,&priv->x1,&priv->x0);
          ec_scalar_select(group,&local_23f0,mask,&priv->y1,&priv->y0);
          ec_precomp_select(group,&local_11a0,mask,&priv->pub0_precomp,&priv->pub1_precomp);
          iVar1 = ec_random_nonzero_scalar(group,&local_27e0,"");
          iVar2 = 0;
          if (iVar1 != 0) {
            iVar1 = ec_random_nonzero_scalar(group,&local_2828,"");
            if (iVar1 != 0) {
              iVar1 = ec_point_mul_scalar_precomp
                                (group,&local_1508,p0,&local_27e0,p1,&local_2828,(EC_PRECOMP *)0x0,
                                 (EC_SCALAR *)0x0);
              if (iVar1 != 0) {
                iVar1 = ec_point_mul_scalar_batch
                                  (group,&local_1430,T,&local_27e0,S,&local_2828,(EC_JACOBIAN *)0x0,
                                   (EC_SCALAR *)0x0);
                if (iVar1 != 0) {
                  iVar1 = ec_random_nonzero_scalar(group,&local_2870,"");
                  if (iVar1 != 0) {
                    iVar1 = ec_random_nonzero_scalar(group,&local_2900,"");
                    if (iVar1 != 0) {
                      iVar1 = ec_random_nonzero_scalar(group,&local_28b8,"");
                      if (iVar1 != 0) {
                        iVar1 = ec_point_mul_scalar_precomp
                                          (group,&local_1358,p0,&local_2900,p1,&local_28b8,
                                           &local_11a0,&local_2870);
                        if (iVar1 != 0) {
                          iVar1 = ec_point_mul_scalar_batch
                                            (group,&local_1280,T,&local_2900,S,&local_28b8,W,
                                             &local_2870);
                          if (iVar1 != 0) {
                            memcpy(&local_1a18,T,0xd8);
                            memcpy(local_1940,S,0xd8);
                            memcpy(local_1868,W,0xd8);
                            memcpy(local_1790,Ws,0xd8);
                            iVar2 = ec_jacobian_to_affine_batch(group,&local_1fb8,&local_1a18,10);
                            if (iVar2 == 0) {
                              iVar2 = 0;
                            }
                            else {
                              ec_affine_select(group,&local_2048,mask,&local_1b38,&local_1c58);
                              ec_affine_select(group,&local_20d8,mask,&local_1aa8,&local_1bc8);
                              ec_affine_select(group,&local_2168,mask,&local_1c58,&local_1b38);
                              ec_affine_select(group,&local_21f8,mask,&local_1bc8,&local_1aa8);
                              iVar1 = hash_c_dleq(method,&local_2438,&priv->pubs,&local_1fb8,
                                                  &local_1f28,&local_1e08,&local_1d78,&local_1ce8);
                              iVar2 = 0;
                              if (iVar1 != 0) {
                                iVar1 = hash_c_dleqor(method,&local_2480,&priv->pub0,&priv->pub1,
                                                      &local_1fb8,&local_1f28,&local_1e98,
                                                      &local_2048,&local_20d8,&local_2168,
                                                      &local_21f8);
                                if (iVar1 != 0) {
                                  ec_scalar_to_montgomery(group,&local_2240,&local_2438);
                                  ec_scalar_mul_montgomery(group,&local_24c8,&priv->xs,&local_2240);
                                  ec_scalar_add(group,&local_24c8,&local_2750,&local_24c8);
                                  ec_scalar_mul_montgomery(group,&local_2510,&priv->ys,&local_2240);
                                  ec_scalar_add(group,&local_2510,&local_2798,&local_2510);
                                  iVar1 = scalar_to_cbb(cbb,group,&local_2438);
                                  iVar2 = 0;
                                  if (iVar1 != 0) {
                                    iVar1 = scalar_to_cbb(cbb,group,&local_24c8);
                                    if (iVar1 != 0) {
                                      iVar1 = scalar_to_cbb(cbb,group,&local_2510);
                                      if (iVar1 != 0) {
                                        ec_scalar_add(group,&local_2708,&local_2480,&local_2870);
                                        ec_scalar_to_montgomery(group,&local_2318,&local_2708);
                                        ec_scalar_mul_montgomery
                                                  (group,&local_2288,&local_23a8,&local_2318);
                                        ec_scalar_add(group,&local_2288,&local_27e0,&local_2288);
                                        ec_scalar_mul_montgomery
                                                  (group,&local_22d0,&local_23f0,&local_2318);
                                        ec_scalar_add(group,&local_22d0,&local_2828,&local_22d0);
                                        ec_scalar_neg(group,&local_2360,&local_2870);
                                        ec_scalar_select(group,&local_2558,mask,&local_2360,
                                                         &local_2708);
                                        ec_scalar_select(group,&local_25e8,mask,&local_2900,
                                                         &local_2288);
                                        ec_scalar_select(group,&local_2678,mask,&local_28b8,
                                                         &local_22d0);
                                        ec_scalar_select(group,&local_25a0,mask,&local_2708,
                                                         &local_2360);
                                        ec_scalar_select(group,&local_2630,mask,&local_2288,
                                                         &local_2900);
                                        ec_scalar_select(group,&local_26c0,mask,&local_22d0,
                                                         &local_28b8);
                                        iVar1 = scalar_to_cbb(cbb,group,&local_2558);
                                        iVar2 = 0;
                                        if (iVar1 != 0) {
                                          iVar1 = scalar_to_cbb(cbb,group,&local_25a0);
                                          if (iVar1 != 0) {
                                            iVar1 = scalar_to_cbb(cbb,group,&local_25e8);
                                            if (iVar1 != 0) {
                                              iVar1 = scalar_to_cbb(cbb,group,&local_2630);
                                              if (iVar1 != 0) {
                                                iVar1 = scalar_to_cbb(cbb,group,&local_2678);
                                                if (iVar1 != 0) {
                                                  iVar2 = scalar_to_cbb(cbb,group,&local_26c0);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int dleq_generate(const PMBTOKEN_METHOD *method, CBB *cbb,
                         const TRUST_TOKEN_ISSUER_KEY *priv,
                         const EC_JACOBIAN *T, const EC_JACOBIAN *S,
                         const EC_JACOBIAN *W, const EC_JACOBIAN *Ws,
                         uint8_t private_metadata) {
  const EC_GROUP *group = method->group;

  // We generate a DLEQ proof for the validity token and a DLEQOR2 proof for the
  // private metadata token. To allow amortizing Jacobian-to-affine conversions,
  // we compute Ki for both proofs first.
  enum {
    idx_T,
    idx_S,
    idx_W,
    idx_Ws,
    idx_Ks0,
    idx_Ks1,
    idx_Kb0,
    idx_Kb1,
    idx_Ko0,
    idx_Ko1,
    num_idx,
  };
  EC_JACOBIAN jacobians[num_idx];

  // Setup the DLEQ proof.
  EC_SCALAR ks0, ks1;
  if (  // ks0, ks1 <- Zp
      !ec_random_nonzero_scalar(group, &ks0, kDefaultAdditionalData) ||
      !ec_random_nonzero_scalar(group, &ks1, kDefaultAdditionalData) ||
      // Ks = ks0*(G;T) + ks1*(H;S)
      !ec_point_mul_scalar_precomp(group, &jacobians[idx_Ks0],
                                   &method->g_precomp, &ks0, &method->h_precomp,
                                   &ks1, NULL, NULL) ||
      !ec_point_mul_scalar_batch(group, &jacobians[idx_Ks1], T, &ks0, S, &ks1,
                                 NULL, NULL)) {
    return 0;
  }

  // Setup the DLEQOR proof. First, select values of xb, yb (keys corresponding
  // to the private metadata value) and pubo (public key corresponding to the
  // other value) in constant time.
  BN_ULONG mask = ((BN_ULONG)0) - (private_metadata & 1);
  EC_PRECOMP pubo_precomp;
  EC_SCALAR xb, yb;
  ec_scalar_select(group, &xb, mask, &priv->x1, &priv->x0);
  ec_scalar_select(group, &yb, mask, &priv->y1, &priv->y0);
  ec_precomp_select(group, &pubo_precomp, mask, &priv->pub0_precomp,
                    &priv->pub1_precomp);

  EC_SCALAR k0, k1, minus_co, uo, vo;
  if (  // k0, k1 <- Zp
      !ec_random_nonzero_scalar(group, &k0, kDefaultAdditionalData) ||
      !ec_random_nonzero_scalar(group, &k1, kDefaultAdditionalData) ||
      // Kb = k0*(G;T) + k1*(H;S)
      !ec_point_mul_scalar_precomp(group, &jacobians[idx_Kb0],
                                   &method->g_precomp, &k0, &method->h_precomp,
                                   &k1, NULL, NULL) ||
      !ec_point_mul_scalar_batch(group, &jacobians[idx_Kb1], T, &k0, S, &k1,
                                 NULL, NULL) ||
      // co, uo, vo <- Zp
      !ec_random_nonzero_scalar(group, &minus_co, kDefaultAdditionalData) ||
      !ec_random_nonzero_scalar(group, &uo, kDefaultAdditionalData) ||
      !ec_random_nonzero_scalar(group, &vo, kDefaultAdditionalData) ||
      // Ko = uo*(G;T) + vo*(H;S) - co*(pubo;W)
      !ec_point_mul_scalar_precomp(group, &jacobians[idx_Ko0],
                                   &method->g_precomp, &uo, &method->h_precomp,
                                   &vo, &pubo_precomp, &minus_co) ||
      !ec_point_mul_scalar_batch(group, &jacobians[idx_Ko1], T, &uo, S, &vo, W,
                                 &minus_co)) {
    return 0;
  }

  EC_AFFINE affines[num_idx];
  jacobians[idx_T] = *T;
  jacobians[idx_S] = *S;
  jacobians[idx_W] = *W;
  jacobians[idx_Ws] = *Ws;
  if (!ec_jacobian_to_affine_batch(group, affines, jacobians, num_idx)) {
    return 0;
  }

  // Select the K corresponding to K0 and K1 in constant-time.
  EC_AFFINE K00, K01, K10, K11;
  ec_affine_select(group, &K00, mask, &affines[idx_Ko0], &affines[idx_Kb0]);
  ec_affine_select(group, &K01, mask, &affines[idx_Ko1], &affines[idx_Kb1]);
  ec_affine_select(group, &K10, mask, &affines[idx_Kb0], &affines[idx_Ko0]);
  ec_affine_select(group, &K11, mask, &affines[idx_Kb1], &affines[idx_Ko1]);

  // Compute c = Hc(...) for the two proofs.
  EC_SCALAR cs, c;
  if (!hash_c_dleq(method, &cs, &priv->pubs, &affines[idx_T], &affines[idx_S],
                   &affines[idx_Ws], &affines[idx_Ks0], &affines[idx_Ks1]) ||
      !hash_c_dleqor(method, &c, &priv->pub0, &priv->pub1, &affines[idx_T],
                     &affines[idx_S], &affines[idx_W], &K00, &K01, &K10,
                     &K11)) {
    return 0;
  }

  // Compute cb, ub, and ub for the two proofs. In each of these products, only
  // one operand is in Montgomery form, so the product does not need to be
  // converted.

  EC_SCALAR cs_mont;
  ec_scalar_to_montgomery(group, &cs_mont, &cs);

  // us = ks0 + cs*xs
  EC_SCALAR us, vs;
  ec_scalar_mul_montgomery(group, &us, &priv->xs, &cs_mont);
  ec_scalar_add(group, &us, &ks0, &us);

  // vs = ks1 + cs*ys
  ec_scalar_mul_montgomery(group, &vs, &priv->ys, &cs_mont);
  ec_scalar_add(group, &vs, &ks1, &vs);

  // Store DLEQ2 proof in transcript.
  if (!scalar_to_cbb(cbb, group, &cs) || !scalar_to_cbb(cbb, group, &us) ||
      !scalar_to_cbb(cbb, group, &vs)) {
    return 0;
  }

  // cb = c - co
  EC_SCALAR cb, ub, vb;
  ec_scalar_add(group, &cb, &c, &minus_co);

  EC_SCALAR cb_mont;
  ec_scalar_to_montgomery(group, &cb_mont, &cb);

  // ub = k0 + cb*xb
  ec_scalar_mul_montgomery(group, &ub, &xb, &cb_mont);
  ec_scalar_add(group, &ub, &k0, &ub);

  // vb = k1 + cb*yb
  ec_scalar_mul_montgomery(group, &vb, &yb, &cb_mont);
  ec_scalar_add(group, &vb, &k1, &vb);

  // Select c, u, v in constant-time.
  EC_SCALAR co, c0, c1, u0, u1, v0, v1;
  ec_scalar_neg(group, &co, &minus_co);
  ec_scalar_select(group, &c0, mask, &co, &cb);
  ec_scalar_select(group, &u0, mask, &uo, &ub);
  ec_scalar_select(group, &v0, mask, &vo, &vb);
  ec_scalar_select(group, &c1, mask, &cb, &co);
  ec_scalar_select(group, &u1, mask, &ub, &uo);
  ec_scalar_select(group, &v1, mask, &vb, &vo);

  // Store DLEQOR2 proof in transcript.
  if (!scalar_to_cbb(cbb, group, &c0) || !scalar_to_cbb(cbb, group, &c1) ||
      !scalar_to_cbb(cbb, group, &u0) || !scalar_to_cbb(cbb, group, &u1) ||
      !scalar_to_cbb(cbb, group, &v0) || !scalar_to_cbb(cbb, group, &v1)) {
    return 0;
  }

  return 1;
}